

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourcesGL.cpp
# Opt level: O2

void Diligent::ProcessUBVariable(ShaderCodeVariableDescX *Var,Uint32 BaseOffset)

{
  pointer pSVar1;
  pointer pSVar2;
  uint uVar3;
  ulong uVar4;
  char (*Args_1) [25];
  __normal_iterator<Diligent::ShaderCodeVariableDescX_*,_std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>_>
  __i;
  pointer pSVar5;
  long lVar6;
  Uint32 i;
  string msg;
  string local_48;
  
  pSVar1 = (Var->Members).
           super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (Var->Members).
           super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar1 != pSVar2) {
    uVar4 = (long)pSVar2 - (long)pSVar1 >> 7;
    lVar6 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::operator()(pSVar1,pSVar2,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)pSVar2 - (long)pSVar1 < 0x801) {
      std::operator()(pSVar1,pSVar2);
    }
    else {
      pSVar5 = pSVar1 + 0x10;
      std::operator()(pSVar1,pSVar5);
      for (; pSVar5 != pSVar2; pSVar5 = pSVar5 + 1) {
        std::operator()(pSVar5);
      }
    }
  }
  pSVar1 = (Var->Members).
           super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (Var->super_ShaderCodeVariableDesc).pMembers = &pSVar1->super_ShaderCodeVariableDesc;
  Args_1 = (char (*) [25])
           ((long)(Var->Members).
                  super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 7);
  local_48._M_dataplus._M_p = (pointer)Args_1;
  uVar3 = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)&local_48);
  (Var->super_ShaderCodeVariableDesc).NumMembers = uVar3;
  lVar6 = 0;
  for (uVar4 = 0; uVar4 < uVar3; uVar4 = uVar4 + 1) {
    ProcessUBVariable((ShaderCodeVariableDescX *)
                      ((long)&(((Var->Members).
                                super__Vector_base<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_ShaderCodeVariableDesc).Name + lVar6),
                      (Var->super_ShaderCodeVariableDesc).Offset);
    uVar3 = (Var->super_ShaderCodeVariableDesc).NumMembers;
    lVar6 = lVar6 + 0x80;
  }
  uVar3 = (Var->super_ShaderCodeVariableDesc).Offset;
  if (uVar3 < BaseOffset) {
    FormatString<char[26],char[25]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Var.Offset >= BaseOffset",Args_1);
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"ProcessUBVariable",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourcesGL.cpp"
               ,0x130);
    std::__cxx11::string::~string((string *)&local_48);
    uVar3 = (Var->super_ShaderCodeVariableDesc).Offset;
  }
  (Var->super_ShaderCodeVariableDesc).Offset = uVar3 - BaseOffset;
  return;
}

Assistant:

static void ProcessUBVariable(ShaderCodeVariableDescX& Var, Uint32 BaseOffset)
{
    // Re-sort by offset
    Var.ProcessMembers(
        [](auto& Members) {
            std::sort(Members.begin(), Members.end(),
                      [](const ShaderCodeVariableDescX& Var1, const ShaderCodeVariableDescX& Var2) {
                          return Var1.Offset < Var2.Offset;
                      });
        });

    for (Uint32 i = 0; i < Var.NumMembers; ++i)
    {
        auto& Member = Var.GetMember(i);
        ProcessUBVariable(Member, Var.Offset);
    }
    VERIFY_EXPR(Var.Offset >= BaseOffset);
    // Convert global offset to relative
    Var.Offset -= BaseOffset;
}